

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O2

DP_WS_Stream
MpiInitWriter(CP_Services Svcs,void *CP_Stream,_SstParams *Params,attr_list DPAttrs,SstStats Stats)

{
  undefined8 *puVar1;
  CManager p_Var2;
  SMPI_Comm comm;
  uint64_t uVar3;
  undefined8 uVar4;
  pthread_mutexattr_t attr;
  
  puVar1 = (undefined8 *)calloc(0xa0,1);
  p_Var2 = (*Svcs->getCManager)(CP_Stream);
  comm = (*Svcs->getMPIComm)(CP_Stream);
  pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
  pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1);
  pthread_mutex_init((pthread_mutex_t *)(puVar1 + 0xf),(pthread_mutexattr_t *)&attr);
  pthread_rwlock_init((pthread_rwlock_t *)(puVar1 + 8),(pthread_rwlockattr_t *)0x0);
  SMPI_Comm_rank(comm,(int *)(puVar1 + 1));
  *puVar1 = CP_Stream;
  uVar3 = GetUniqueTaskId();
  puVar1[2] = uVar3;
  puVar1[4] = 0;
  puVar1[5] = puVar1 + 4;
  puVar1[6] = 0;
  puVar1[7] = puVar1 + 6;
  uVar4 = CMregister_format(p_Var2,MpiReadRequestStructs);
  CMregister_handler(uVar4,MpiReadRequestHandler,Svcs);
  uVar4 = CMregister_format(p_Var2,MpiReadReplyStructs);
  puVar1[3] = uVar4;
  (*Svcs->verbose)(CP_Stream,5,"MpiInitWriter initialized addr=%p\n",puVar1);
  return puVar1;
}

Assistant:

static DP_WS_Stream MpiInitWriter(CP_Services Svcs, void *CP_Stream, struct _SstParams *Params,
                                  attr_list DPAttrs, SstStats Stats)
{
    MpiStreamWR Stream = calloc(sizeof(struct _MpiStreamWR), 1);
    CManager cm = Svcs->getCManager(CP_Stream);
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;

    /* Make MutexReaders to be recursive */
    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&Stream->MutexReaders, &attr);

    pthread_rwlock_init(&Stream->LockTS, NULL);

    SMPI_Comm_rank(comm, &Stream->Stream.Rank);

    Stream->Stream.CP_Stream = CP_Stream;
    Stream->Stream.taskID = GetUniqueTaskId();
    STAILQ_INIT(&Stream->TimeSteps);
    TAILQ_INIT(&Stream->Readers);

    /* * add a handler for read request messages */
    F = CMregister_format(cm, MpiReadRequestStructs);
    CMregister_handler(F, MpiReadRequestHandler, Svcs);

    /* * register read reply message structure so we can send later */
    Stream->ReadReplyFormat = CMregister_format(cm, MpiReadReplyStructs);

    Svcs->verbose(CP_Stream, DPTraceVerbose, "MpiInitWriter initialized addr=%p\n", Stream);

    return (void *)Stream;
}